

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleDirectoryMode(cmGetPropertyCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  PolicyStatus PVar7;
  char *pcVar8;
  cmGlobalGenerator *this_00;
  cmMakefile *this_01;
  PolicyID id;
  string dir;
  string local_68;
  string local_48;
  
  sVar3 = (this->Name)._M_string_length;
  if (sVar3 == 0) {
    this_01 = (this->super_cmCommand).Makefile;
  }
  else {
    paVar1 = &local_68.field_2;
    pcVar4 = (this->Name)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar4,pcVar4 + sVar3);
    bVar5 = cmsys::SystemTools::FileIsFullPath(local_68._M_dataplus._M_p);
    if (!bVar5) {
      pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      strlen(pcVar8);
      std::__cxx11::string::_M_replace
                ((ulong)&local_68,0,(char *)local_68._M_string_length,(ulong)pcVar8);
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)(this->Name)._M_dataplus._M_p);
    }
    cmsys::SystemTools::CollapseFullPath(&local_48,&local_68);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    paVar2 = &local_48.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    this_01 = cmGlobalGenerator::FindMakefile(this_00,&local_68);
    if (this_01 == (cmMakefile *)0x0) {
      local_48._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,"");
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = std::__cxx11::string::compare((char *)&this->PropertyName);
  if (iVar6 == 0) {
    PVar7 = cmMakefile::GetPolicyStatus(this_01,CMP0059);
    if (PVar7 != OLD) {
      if (PVar7 != WARN) goto LAB_002b0af2;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_68,(cmPolicies *)0x3b,id);
      cmMakefile::IssueMessage(this_01,AUTHOR_WARNING,&local_68,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar8 = cmMakefile::GetDefineFlagsCMP0059(this_01);
  }
  else {
LAB_002b0af2:
    pcVar8 = cmMakefile::GetProperty(this_01,&this->PropertyName);
  }
  StoreResult(this,pcVar8);
  return true;
}

Assistant:

bool cmGetPropertyCommand::HandleDirectoryMode()
{
  // Default to the current directory.
  cmMakefile* mf = this->Makefile;

  // Lookup the directory if given.
  if(!this->Name.empty())
    {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = this->Name;
    if(!cmSystemTools::FileIsFullPath(dir.c_str()))
      {
      dir = this->Makefile->GetCurrentSourceDirectory();
      dir += "/";
      dir += this->Name;
      }

    // The local generators are associated with collapsed paths.
    dir = cmSystemTools::CollapseFullPath(dir);

    // Lookup the generator.
    mf = this->Makefile->GetGlobalGenerator()->FindMakefile(dir);
    if (!mf)
      {
      // Could not find the directory.
      this->SetError
        ("DIRECTORY scope provided but requested directory was not found. "
         "This could be because the directory argument was invalid or, "
         "it is valid but has not been processed yet.");
      return false;
      }
    }

  if (this->PropertyName == "DEFINITIONS")
    {
    switch(mf->GetPolicyStatus(cmPolicies::CMP0059))
      {
      case cmPolicies::WARN:
        mf->IssueMessage(cmake::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
      case cmPolicies::OLD:
        return this->StoreResult(mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
      }
    }

  // Get the property.
  return this->StoreResult(mf->GetProperty(this->PropertyName));
}